

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalGetFileSize
                    (CPalThread *pThread,HANDLE hFile,DWORD *pdwFileSizeLow,DWORD *pdwFileSizeHigh)

{
  int iVar1;
  undefined1 local_d8 [8];
  stat stat_data;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  DWORD *pDStack_28;
  PAL_ERROR palError;
  DWORD *pdwFileSizeHigh_local;
  DWORD *pdwFileSizeLow_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  stat_data.__glibc_reserved[2] = 0;
  pDStack_28 = pdwFileSizeHigh;
  pdwFileSizeHigh_local = pdwFileSizeLow;
  pdwFileSizeLow_local = (DWORD *)hFile;
  hFile_local = pThread;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pFileObject._4_4_ = 6;
  }
  else {
    pFileObject._4_4_ =
         (**(code **)(*g_pObjectManager + 0x28))
                   (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalData);
    if ((pFileObject._4_4_ == 0) &&
       (pFileObject._4_4_ =
             (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                       (pLocalData,hFile_local,0,stat_data.__glibc_reserved + 2,&pLocalDataLock),
       pFileObject._4_4_ == 0)) {
      iVar1 = fstat64(*(int *)&pLocalDataLock[1]._vptr_IDataLock,(stat64 *)local_d8);
      if (iVar1 == 0) {
        *pdwFileSizeHigh_local = (DWORD)stat_data.st_rdev;
        if (pDStack_28 != (DWORD *)0x0) {
          *pDStack_28 = (DWORD)(stat_data.st_rdev >> 0x20);
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pFileObject._4_4_ = FILEGetLastErrorFromErrno();
      }
    }
  }
  if (stat_data.__glibc_reserved[2] != 0) {
    (*(code *)**(undefined8 **)stat_data.__glibc_reserved[2])
              (stat_data.__glibc_reserved[2],hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetFileSize(
    CPalThread *pThread,
    HANDLE hFile,
    DWORD *pdwFileSizeLow,
    DWORD *pdwFileSizeHigh
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    struct stat stat_data;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalGetFileSizeExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileSizeExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileSizeExit;
    }

    if (fstat(pLocalData->unix_fd, &stat_data) != 0)
    {
        ERROR("fstat failed of file descriptor %d\n", pLocalData->unix_fd);
        palError = FILEGetLastErrorFromErrno();
        goto InternalGetFileSizeExit;
    }

    *pdwFileSizeLow = (DWORD)stat_data.st_size;
    
    if (NULL != pdwFileSizeHigh)
    {
#if SIZEOF_OFF_T > 4
        *pdwFileSizeHigh = (DWORD)(stat_data.st_size >> 32);
#else
        *pdwFileSizeHigh = 0;
#endif
    }

InternalGetFileSizeExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}